

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyDoor::Serialize(DPolyDoor *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  DPolyDoor *this_local;
  
  DMovePoly::Serialize(&this->super_DMovePoly,arc);
  pFVar1 = ::operator<<(arc,&this->m_Direction);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_TotalDist);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Tics);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_WaitTics);
  pFVar1 = ::operator<<(pFVar1,&this->m_Type);
  FArchive::operator<<(pFVar1,&this->m_Close);
  return;
}

Assistant:

void DPolyDoor::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Direction << m_TotalDist << m_Tics << m_WaitTics << m_Type << m_Close;
}